

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Ptr_t *
Acb_TransformPatchFunctions(Vec_Ptr_t *vSops,Vec_Wec_t *vSupps,Vec_Int_t **pvUsed,int nDivs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  char *pSop_1;
  char *pToken;
  char *pStrCopy;
  char *pSop;
  int local_58;
  int iVar;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vPres;
  Vec_Int_t *vMap;
  Vec_Int_t *vUsed;
  Vec_Ptr_t *vFuncs;
  int nDivs_local;
  Vec_Int_t **pvUsed_local;
  Vec_Wec_t *vSupps_local;
  Vec_Ptr_t *vSops_local;
  
  iVar1 = Vec_PtrSize(vSops);
  p = Vec_PtrAlloc(iVar1);
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntStartFull(nDivs);
  p_02 = Vec_IntStart(nDivs);
  for (iVar = 0; iVar1 = Vec_WecSize(vSupps), iVar < iVar1; iVar = iVar + 1) {
    pVVar5 = Vec_WecEntry(vSupps,iVar);
    pcVar6 = (char *)Vec_PtrEntry(vSops,iVar);
    pcVar6 = Abc_UtilStrsav(pcVar6);
    pSop_1 = strtok(pcVar6,"\n");
    while (pSop_1 != (char *)0x0) {
      for (local_58 = 0; pSop_1[local_58] != ' '; local_58 = local_58 + 1) {
        if (pSop_1[local_58] != '-') {
          iVar1 = Vec_IntEntry(pVVar5,local_58);
          Vec_IntWriteEntry(p_02,iVar1,1);
        }
      }
      pSop_1 = strtok((char *)0x0,"\n");
    }
    if (pcVar6 != (char *)0x0) {
      free(pcVar6);
    }
  }
  for (iVar = 0; iVar1 = Vec_WecSize(vSupps), iVar < iVar1; iVar = iVar + 1) {
    pVVar5 = Vec_WecEntry(vSupps,iVar);
    for (local_58 = 0; iVar1 = Vec_IntSize(pVVar5), local_58 < iVar1; local_58 = local_58 + 1) {
      iVar1 = Vec_IntEntry(pVVar5,local_58);
      iVar2 = Vec_IntEntry(p_02,iVar1);
      if ((iVar2 != 0) && (iVar2 = Vec_IntEntry(p_01,iVar1), iVar2 < 0)) {
        iVar2 = Vec_IntSize(p_00);
        Vec_IntWriteEntry(p_01,iVar1,iVar2);
        Vec_IntPush(p_00,iVar1);
      }
    }
  }
  uVar3 = Vec_IntSum(p_02);
  uVar4 = Vec_IntSize(p_02);
  printf("The number of used variables %d (out of %d).\n",(ulong)uVar3,(ulong)uVar4);
  for (iVar = 0; iVar1 = Vec_WecSize(vSupps), iVar < iVar1; iVar = iVar + 1) {
    pVVar5 = Vec_WecEntry(vSupps,iVar);
    pcVar6 = (char *)Vec_PtrEntry(vSops,iVar);
    iVar1 = Vec_IntSize(p_00);
    pcVar6 = Acb_RemapOneFunction(pcVar6,pVVar5,p_01,iVar1);
    Vec_PtrPush(p,pcVar6);
  }
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  *pvUsed = p_00;
  return p;
}

Assistant:

Vec_Ptr_t * Acb_TransformPatchFunctions( Vec_Ptr_t * vSops, Vec_Wec_t * vSupps, Vec_Int_t ** pvUsed, int nDivs )
{
    Vec_Ptr_t * vFuncs = Vec_PtrAlloc( Vec_PtrSize(vSops) );
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 ); 
    Vec_Int_t * vMap = Vec_IntStartFull( nDivs );
    Vec_Int_t * vPres = Vec_IntStart( nDivs );
    Vec_Int_t * vLevel;
    int i, k, iVar;
    // check what divisors are used
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        char * pStrCopy = Abc_UtilStrsav( pSop );
        char * pToken = strtok( pStrCopy, "\n" ); 
        while ( pToken != NULL )
        {
            for ( k = 0; pToken[k] != ' '; k++ )
                if ( pToken[k] != '-' )
                    Vec_IntWriteEntry( vPres, Vec_IntEntry(vLevel, k), 1 );
            pToken = strtok( NULL, "\n" );
        }
        ABC_FREE( pStrCopy );
    }
    // create common order
    Vec_WecForEachLevel( vSupps, vLevel, i )
        Vec_IntForEachEntry( vLevel, iVar, k )
        {
            if ( !Vec_IntEntry(vPres, iVar) )
                continue;
            if ( Vec_IntEntry(vMap, iVar) >= 0 )
                continue;
            Vec_IntWriteEntry( vMap, iVar, Vec_IntSize(vUsed) );
            Vec_IntPush( vUsed, iVar );
        }
    printf( "The number of used variables %d (out of %d).\n", Vec_IntSum(vPres), Vec_IntSize(vPres) );
    // remap SOPs
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        pSop = Acb_RemapOneFunction( pSop, vLevel, vMap, Vec_IntSize(vUsed) );
        //printf( "Function %d\n%s", i, pSop );
        Vec_PtrPush( vFuncs, pSop );
    }
    Vec_IntFree( vPres );
    Vec_IntFree( vMap );
    *pvUsed = vUsed;
    return vFuncs;
}